

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<boost::range_detail::integer_iterator<int>>,boost::integer_range<int>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<boost::range_detail::integer_iterator<int>_> *lhs,char *op,
          integer_range<int> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  integer_range<int> *local_28;
  integer_range<int> *rhs_local;
  char *op_local;
  iterator_range<boost::range_detail::integer_iterator<int>_> *lhs_local;
  
  local_28 = (integer_range<int> *)op;
  rhs_local = (integer_range<int> *)lhs;
  op_local = (char *)this;
  lhs_local = (iterator_range<boost::range_detail::integer_iterator<int>_> *)__return_storage_ptr__;
  toString<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_true>
            (&local_58,(iterator_range<boost::range_detail::integer_iterator<int>_> *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<boost::integer_range<int>,_true>(&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }